

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
 __thiscall
pstore::index::details::linear_node::allocate
          (linear_node *this,size_t num_children,linear_node *from_node)

{
  linear_node *this_00;
  
  this_00 = (linear_node *)operator_new(0x18,(nchildren)num_children);
  linear_node(this_00,num_children);
  *(linear_node **)(this->signature_)._M_elems = this_00;
  if (from_node->size_ < num_children) {
    num_children = from_node->size_;
  }
  if (num_children != 0) {
    memcpy(this_00->leaves_,from_node->leaves_,num_children << 3);
  }
  return (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
          )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<linear_node> linear_node::allocate (std::size_t const num_children,
                                                                linear_node const & from_node) {
                // Allocate the new node and fill in the basic fields.
                auto new_node = std::unique_ptr<linear_node> (new (nchildren{num_children})
                                                                  linear_node (num_children));

                std::size_t const num_to_copy = std::min (num_children, from_node.size ());
                auto const * const src_begin = from_node.leaves_;
                // Note that the last argument is '&leaves[0]' rather than just 'leaves' to defeat
                // an MSVC debug assertion that thinks it knows how big the leaves_ array is...
                std::copy (src_begin, src_begin + num_to_copy, &new_node->leaves_[0]);

                return new_node;
            }